

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_SetPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_SetPeginWitnessStack_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  char *pcVar2;
  ScriptWitness local_280;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  AssertionResult gtest_ar;
  ByteData exp_data;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_218;
  ScriptWitness exp_witness_stack;
  ScriptWitness exp_pegin_witness;
  ScriptWitness local_1c0;
  ScriptWitness local_1a0;
  ConfidentialTxIn txin;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  std::__cxx11::string::string((string *)&txin,"1234567890",(allocator *)&local_280);
  cfd::core::ByteData::ByteData(&exp_data,(string *)&txin);
  std::__cxx11::string::~string((string *)&txin);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxIn::SetPeginWitnessStack((uint)&local_1a0,(ByteData *)&txin);
      cfd::core::ScriptWitness::~ScriptWitness(&local_1a0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,200,
               "Expected: (txin.SetPeginWitnessStack(target_index, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_280);
  }
  cfd::core::ScriptWitness::ScriptWitness(&local_280,&txin.pegin_witness_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ScriptWitness::~ScriptWitness(&local_280);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  lhs = local_280._vptr_ScriptWitness;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",(char *)lhs,
             (char *)local_260._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_280);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialTxIn::GetWitnessHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txin.GetWitnessHash().GetHex().c_str()",
             "\"78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd\"",
             (char *)local_280._vptr_ScriptWitness,
             "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");
  std::__cxx11::string::~string((string *)&local_280);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_260);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_280);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ConfidentialTxIn::SetPeginWitnessStack((uint)&local_1c0,(ByteData *)&txin);
    cfd::core::ScriptWitness::~ScriptWitness(&local_1c0);
  }
  testing::Message::Message((Message *)&local_280);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
             ,0xd2,
             "Expected: (txin.SetPeginWitnessStack(9, exp_data)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_280);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_280);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_218);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
  cfd::core::ScriptWitness::~ScriptWitness(&exp_pegin_witness);
  cfd::core::ScriptWitness::~ScriptWitness(&exp_witness_stack);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 1;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.SetPeginWitnessStack(target_index, exp_data)));
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());

  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");

  // fail case
  EXPECT_THROW((txin.SetPeginWitnessStack(9, exp_data)), CfdException);
}